

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

InterpretResult run(Vm *vm)

{
  undefined8 *puVar1;
  ObjectType OVar2;
  ValueType VVar3;
  uint32_t index;
  CallFrame *pCVar4;
  uint8_t *puVar5;
  CrispyValue *pCVar6;
  ObjList *pOVar7;
  Object *pOVar8;
  CallFrame **ppCVar9;
  object_t *poVar10;
  HashTable content;
  undefined4 uVar11;
  _Bool _Var12;
  int iVar13;
  InterpretResult IVar14;
  ValueType VVar15;
  CrispyValue *pCVar16;
  byte bVar19;
  ObjDict *object;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 aVar17;
  ObjString *list_00;
  CallFrame *pCVar18;
  uint uVar20;
  long lVar21;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 in_RDX;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_00;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_01;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_02;
  long lVar22;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_04;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_05;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_06;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_07;
  undefined1 *puVar23;
  char *__ptr;
  ObjList *list;
  byte *pbVar24;
  byte *pbVar25;
  long lVar26;
  bool bVar27;
  double dVar28;
  double dVar29;
  undefined8 uVar30;
  undefined1 auVar31 [8];
  HTItemKey key;
  HTItemKey key_00;
  CrispyValue value_00;
  HTItemKey key_01;
  CrispyValue value_01;
  CrispyValue CVar32;
  undefined1 auVar33 [16];
  CrispyValue value_02;
  CrispyValue second;
  CrispyValue second_00;
  CrispyValue second_01;
  CrispyValue second_02;
  CrispyValue second_03;
  CrispyValue second_04;
  CrispyValue value_03;
  CrispyValue first;
  CrispyValue first_00;
  CrispyValue first_01;
  CrispyValue first_02;
  CrispyValue value_04;
  CrispyValue first_03;
  CrispyValue first_04;
  CrispyValue value_05;
  size_t sVar34;
  undefined1 auStack_98 [8];
  CrispyValue value;
  HTItem **ppHStack_80;
  CrispyValue *local_38;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_03;
  
  pCVar4 = (vm->frames).frame_pointers[vm->frame_count - 1];
  puVar5 = (pCVar4->code_buffer).code;
  pCVar6 = (pCVar4->constants).values;
  local_38 = vm->sp;
  pbVar24 = pCVar4->ip;
LAB_00103010:
  if ((long)local_38 - (long)vm < 0) {
    puts("Negative stack pointer");
    return INTERPRET_RUNTIME_ERROR;
  }
  if (0x31 < *pbVar24) {
    printf("Unknown instruction %d\n");
    return INTERPRET_RUNTIME_ERROR;
  }
  pbVar25 = pbVar24 + 1;
  switch(*pbVar24) {
  default:
    _Var12 = false;
    goto LAB_00103408;
  case 1:
    _Var12 = true;
LAB_00103408:
    CVar32 = create_bool(_Var12);
    goto LAB_0010368b;
  case 3:
    CVar32 = create_nil();
    goto LAB_0010368b;
  case 4:
    VVar15 = local_38[-1].type;
    aVar17 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)local_38[-1].field_1.o_value;
    pOVar7 = (ObjList *)local_38[-2].field_1.o_value;
    in_RDX._0_4_ = VVar15 ^ NUMBER | local_38[-2].type ^ NUMBER;
    in_RDX.p_value._4_4_ = 0;
    if (in_RDX._0_4_ != NIL) {
      if (local_38[-2].type == OBJECT) {
        (pOVar7->object).marked = '\x01';
        OVar2 = (pOVar7->object).type;
        if (OVar2 == OBJ_LIST) {
          list_00 = (ObjString *)clone_list(vm,pOVar7);
          value_01._4_4_ = 0;
          value_01.type = VVar15;
          value_01.field_1.o_value = (Object *)aVar17.p_value;
          list_append((ObjList *)list_00,value_01);
        }
        else {
          if (OVar2 != OBJ_STRING) goto LAB_00103c95;
          if ((VVar15 != OBJECT) || ((aVar17.o_value)->type != OBJ_STRING)) {
            __ptr = "Only strings can be appended to strings. Consider using the \'str\' function\n"
            ;
            sVar34 = 0x4b;
            goto LAB_00103cd0;
          }
          (aVar17.o_value)->marked = '\x01';
          list_00 = new_empty_string(vm,*(long *)(aVar17.p_value + 0x10) + (pOVar7->content).cap);
          memcpy(list_00->start,(void *)(pOVar7->content).count,(pOVar7->content).cap);
          pOVar8 = (Object *)(aVar17.p_value + 0x10);
          sVar34._0_1_ = pOVar8->marked;
          sVar34._1_3_ = *(undefined3 *)&pOVar8->field_0x1;
          sVar34._4_4_ = pOVar8->type;
          memcpy(list_00->start + (pOVar7->content).cap,*(object_t **)(aVar17.p_value + 0x18),sVar34
                );
        }
        CVar32 = create_object(&list_00->object);
        in_RDX = CVar32.field_1;
        local_38[-2].type = CVar32.type;
        local_38[-2].field_1.p_value = (uint64_t)in_RDX;
        goto LAB_00103ad5;
      }
LAB_00103c95:
      __ptr = "Invalid target for addition\n";
      sVar34 = 0x1c;
      goto LAB_00103cd0;
    }
    local_38[-2].type = NUMBER;
    local_38[-2].field_1.d_value = aVar17.d_value + (double)pOVar7;
    local_38 = local_38 + -1;
    pbVar24 = pbVar25;
    goto LAB_00103010;
  case 5:
    if (local_38[-2].type != NUMBER) {
      return INTERPRET_RUNTIME_ERROR;
    }
    if (local_38[-1].type != NUMBER) {
      return INTERPRET_RUNTIME_ERROR;
    }
    dVar29 = local_38[-2].field_1.d_value - local_38[-1].field_1.d_value;
    goto LAB_00103583;
  case 6:
    if (local_38[-2].type != NUMBER) {
      return INTERPRET_RUNTIME_ERROR;
    }
    if (local_38[-1].type != NUMBER) {
      return INTERPRET_RUNTIME_ERROR;
    }
    dVar29 = local_38[-2].field_1.d_value * local_38[-1].field_1.d_value;
LAB_00103583:
    local_38[-2].field_1.d_value = dVar29;
LAB_00103589:
    local_38 = local_38 + -1;
    pbVar24 = pbVar25;
    goto LAB_00103010;
  case 7:
    if (local_38[-2].type != NUMBER) {
      return INTERPRET_RUNTIME_ERROR;
    }
    if (local_38[-1].type != NUMBER) {
      return INTERPRET_RUNTIME_ERROR;
    }
    dVar29 = local_38[-1].field_1.d_value;
    if ((dVar29 == 0.0) && (!NAN(dVar29))) {
      fprintf(_stderr,"%s\n","Cannot divide by zero\n");
      while (vm->frame_count != 0) {
        ppCVar9 = (vm->frames).frame_pointers;
        uVar20 = vm->frame_count - 1;
        vm->frame_count = uVar20;
        printf("%p\n",ppCVar9[uVar20]->ip);
        puts("Callframe");
      }
      vm_free(vm);
      exit(0x2c);
    }
    local_38[-2].type = NUMBER;
    local_38[-2].field_1.d_value = local_38[-2].field_1.d_value / dVar29;
    goto LAB_00103589;
  case 8:
    if ((local_38[-2].type != NUMBER) || (local_38[-1].type != NUMBER)) {
      fprintf(_stderr,"Modulo operator (%%) only works on numbers\n");
      return INTERPRET_RUNTIME_ERROR;
    }
    dVar29 = (double)((long)local_38[-2].field_1.d_value % (long)local_38[-1].field_1.d_value);
    goto LAB_0010361a;
  case 9:
    if (local_38[-2].type != NUMBER) {
      return INTERPRET_RUNTIME_ERROR;
    }
    if (local_38[-1].type != NUMBER) {
      return INTERPRET_RUNTIME_ERROR;
    }
    dVar29 = pow(local_38[-2].field_1.d_value,local_38[-1].field_1.d_value);
LAB_0010361a:
    CVar32 = create_number(dVar29);
    goto LAB_001035d7;
  case 10:
    if (local_38[-2].type != BOOLEAN) {
      return INTERPRET_RUNTIME_ERROR;
    }
    if (local_38[-1].type != BOOLEAN) {
      return INTERPRET_RUNTIME_ERROR;
    }
    bVar27 = local_38[-1].field_1.p_value != 0 && local_38[-2].field_1.p_value != 0;
    goto LAB_001035d2;
  case 0xb:
    if (local_38[-2].type != BOOLEAN) {
      return INTERPRET_RUNTIME_ERROR;
    }
    if (local_38[-1].type != BOOLEAN) {
      return INTERPRET_RUNTIME_ERROR;
    }
    bVar27 = local_38[-1].field_1.p_value == 0 && local_38[-2].field_1.p_value == 0;
    goto LAB_0010355b;
  case 0xc:
    second_01._4_4_ = 0;
    second_01.type = local_38[-1].type;
    first_01._4_4_ = 0;
    first_01.type = local_38[-2].type;
    second_01.field_1.p_value = local_38[-1].field_1.p_value;
    first_01.field_1.p_value = local_38[-2].field_1.p_value;
    iVar13 = cmp_values(first_01,second_01);
    bVar27 = iVar13 == 0;
    goto LAB_001035d2;
  case 0xd:
    second_04._4_4_ = 0;
    second_04.type = local_38[-1].type;
    first_04._4_4_ = 0;
    first_04.type = local_38[-2].type;
    second_04.field_1.p_value = local_38[-1].field_1.p_value;
    first_04.field_1.p_value = local_38[-2].field_1.p_value;
    iVar13 = cmp_values(first_04,second_04);
    bVar27 = iVar13 == 0;
LAB_0010355b:
    bVar27 = !bVar27;
    goto LAB_001035d2;
  case 0xe:
    second_00._4_4_ = 0;
    second_00.type = local_38[-1].type;
    first_00._4_4_ = 0;
    first_00.type = local_38[-2].type;
    second_00.field_1.p_value = local_38[-1].field_1.p_value;
    first_00.field_1.p_value = local_38[-2].field_1.p_value;
    iVar13 = cmp_values(first_00,second_00);
    bVar27 = 0 < iVar13;
    goto LAB_001035d2;
  case 0xf:
    second_02._4_4_ = 0;
    second_02.type = local_38[-1].type;
    first_02._4_4_ = 0;
    first_02.type = local_38[-2].type;
    second_02.field_1.p_value = local_38[-1].field_1.p_value;
    first_02.field_1.p_value = local_38[-2].field_1.p_value;
    iVar13 = cmp_values(first_02,second_02);
    bVar19 = (byte)((uint)iVar13 >> 0x18);
    goto LAB_0010342b;
  case 0x10:
    second._4_4_ = 0;
    second.type = local_38[-1].type;
    first._4_4_ = 0;
    first.type = local_38[-2].type;
    second.field_1.p_value = local_38[-1].field_1.p_value;
    first.field_1.p_value = local_38[-2].field_1.p_value;
    iVar13 = cmp_values(first,second);
    bVar19 = ~(byte)((uint)iVar13 >> 0x18);
LAB_0010342b:
    bVar27 = (bool)(bVar19 >> 7);
    goto LAB_001035d2;
  case 0x11:
    second_03._4_4_ = 0;
    second_03.type = local_38[-1].type;
    first_03._4_4_ = 0;
    first_03.type = local_38[-2].type;
    second_03.field_1.p_value = local_38[-1].field_1.p_value;
    first_03.field_1.p_value = local_38[-2].field_1.p_value;
    iVar13 = cmp_values(first_03,second_03);
    bVar27 = iVar13 < 1;
LAB_001035d2:
    CVar32 = create_bool(bVar27);
LAB_001035d7:
    in_RDX = CVar32.field_1;
    local_38[-2].type = CVar32.type;
    local_38[-2].field_1.p_value = (uint64_t)in_RDX;
LAB_001035df:
    local_38 = local_38 + -1;
    pbVar24 = pbVar25;
    goto LAB_00103010;
  case 0x12:
    uVar20 = (uint)pbVar24[1];
    pbVar25 = pbVar24 + 2;
    goto LAB_00103703;
  case 0x13:
    pbVar25 = pbVar24 + 3;
    uVar20 = (uint)(ushort)(*(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8);
LAB_00103703:
    puVar1 = (undefined8 *)((long)&pCVar6->type + (ulong)(uVar20 << 4));
    uVar30 = *puVar1;
    aVar17 = *(anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(puVar1 + 1);
LAB_00103741:
    *(undefined8 *)local_38 = uVar30;
    local_38->field_1 = aVar17;
    local_38 = local_38 + 1;
    pbVar24 = pbVar25;
    goto LAB_00103010;
  case 0x14:
    dVar29 = 0.0;
    goto LAB_00103534;
  case 0x15:
    dVar29 = 1.0;
LAB_00103534:
    CVar32 = create_number(dVar29);
    goto LAB_0010368b;
  case 0x16:
    value_03._4_4_ = 0;
    value_03.type = local_38[-1].type;
    value_03.field_1.p_value = local_38[-1].field_1.p_value;
    write_at(&pCVar4->variables,(ulong)pbVar24[1],value_03);
    in_RDX = extraout_RDX_03;
    local_38 = local_38 + -1;
    pbVar24 = pbVar24 + 2;
    goto LAB_00103010;
  case 0x17:
    pCVar16 = (pCVar4->variables).values;
    bVar19 = pbVar24[1];
    pbVar25 = pbVar24 + 2;
    goto LAB_00103739;
  case 0x18:
    bVar19 = pbVar24[2];
    pbVar25 = pbVar24 + 3;
    in_RDX = (anon_union_8_3_4e733eb7_for_CrispyValue_1)(vm->frames).frame_pointers;
    pCVar16 = (((CallFrame **)(in_RDX.p_value - 8))[pbVar24[1]]->variables).values;
LAB_00103739:
    uVar30 = *(undefined8 *)(pCVar16 + bVar19);
    aVar17 = pCVar16[bVar19].field_1;
    goto LAB_00103741;
  case 0x19:
    in_RDX = (anon_union_8_3_4e733eb7_for_CrispyValue_1)(vm->frames).frame_pointers;
    uVar11 = *(undefined4 *)&local_38[-1].field_0x4;
    aVar17 = local_38[-1].field_1;
    pCVar16 = (((CallFrame **)(in_RDX.p_value - 8))[pbVar24[1]]->variables).values + pbVar24[2];
    pCVar16->type = local_38[-1].type;
    *(undefined4 *)&pCVar16->field_0x4 = uVar11;
    pCVar16->field_1 = aVar17;
    local_38 = local_38 + -1;
    pbVar24 = pbVar24 + 3;
    goto LAB_00103010;
  case 0x1a:
    auVar31._0_4_ = local_38[-1].type;
    auVar31._4_4_ = *(uint32_t *)&local_38[-1].field_0x4;
    aVar17 = local_38[-1].field_1;
LAB_00103803:
    local_38->type = auVar31._0_4_;
    *(uint32_t *)&local_38->field_0x4 = auVar31._4_4_;
    local_38->field_1 = aVar17;
    goto LAB_00103693;
  case 0x1b:
    local_38 = local_38 + -1;
    pbVar24 = pbVar25;
    goto LAB_00103010;
  case 0x1c:
    bVar19 = pbVar24[1];
    pCVar16 = local_38 + -(ulong)bVar19;
    if (pCVar16[-1].type != OBJECT) {
      __ptr = "Trying to call primitive CrispyValue\n";
      sVar34 = 0x25;
      goto LAB_00103cd0;
    }
    pOVar8 = pCVar16[-1].field_1.o_value;
    pOVar8->marked = '\x01';
    if (pOVar8->type == OBJ_LAMBDA) {
      if (pOVar8[1].marked != bVar19) {
LAB_00103c07:
        fprintf(_stderr,"Invalid number of arguments. Expected %d, but got %d\n");
        return INTERPRET_RUNTIME_ERROR;
      }
      lVar22 = (ulong)bVar19 * -0x10;
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar22) = 0xfffffffffffffff0;
      lVar21 = *(long *)(&stack0xffffffffffffff60 + lVar22);
      for (lVar26 = 0; (ulong)bVar19 * 0x10 != lVar26; lVar26 = lVar26 + 0x10) {
        puVar1 = (undefined8 *)((long)&local_38->type + lVar21);
        uVar30 = puVar1[1];
        *(undefined8 *)(auStack_98 + lVar26 + lVar22 + -0x98 + 0x98) = *puVar1;
        *(undefined8 *)((long)(auStack_98 + lVar26 + lVar22 + -0x98 + 0x98) + 8) = uVar30;
        lVar21 = lVar21 + -0x10;
      }
      pCVar18 = (CallFrame *)pOVar8[1].next;
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar22) = 0x1039e0;
      pCVar18 = new_temp_call_frame(pCVar18);
      index = vm->frame_count;
      vm->frame_count = index + 1;
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar22) = 0x1039fb;
      frames_write_at(&vm->frames,index,pCVar18);
      pCVar16 = (CrispyValue *)((long)local_38 - lVar26);
      for (lVar21 = 0; (ulong)bVar19 << 4 != lVar21; lVar21 = lVar21 + 0x10) {
        aVar17 = *(anon_union_8_3_4e733eb7_for_CrispyValue_1 *)
                  ((long)(auStack_98 + lVar21 + lVar22 + -0x98 + 0x98) + 8);
        *(undefined8 *)pCVar16 = *(undefined8 *)(auStack_98 + lVar21 + lVar22 + -0x98 + 0x98);
        pCVar16->field_1 = aVar17;
        pCVar16 = pCVar16 + 1;
      }
      vm->sp = local_38;
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar22) = 0x103a38;
      IVar14 = run(vm);
      ppCVar9 = (vm->frames).frame_pointers;
      uVar20 = vm->frame_count - 1;
      vm->frame_count = uVar20;
      pCVar18 = ppCVar9[uVar20];
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar22) = 0x103a59;
      temp_call_frame_free(pCVar18);
      in_RDX = extraout_RDX_06;
      local_38 = (CrispyValue *)((long)local_38 - lVar26);
      pbVar24 = pbVar24 + 2;
      if (IVar14 != INTERPRET_OK) {
        return IVar14;
      }
    }
    else {
      if (pOVar8->type != OBJ_NATIVE_FUNC) {
        __ptr = "Trying to call non callable Object\n";
LAB_00103cce:
        sVar34 = 0x23;
        goto LAB_00103cd0;
      }
      if (pOVar8[1].field_0x1 != bVar19) goto LAB_00103c07;
      lVar21 = (ulong)bVar19 * -0x10;
      puVar23 = auStack_98 + lVar21;
      for (lVar22 = 0; (ulong)bVar19 * 0x10 != lVar22; lVar22 = lVar22 + 0x10) {
        puVar1 = (undefined8 *)((long)&pCVar16->type + lVar22);
        uVar30 = puVar1[1];
        *(undefined8 *)(puVar23 + lVar22) = *puVar1;
        *(undefined8 *)((long)(puVar23 + lVar22) + 8) = uVar30;
      }
      if (pOVar8[1].marked == '\0') {
        poVar10 = pOVar8[1].next;
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar21) = 0x103ae4;
        VVar15 = (*(code *)poVar10)();
        in_RDX = extraout_RDX_07;
      }
      else {
        vm->sp = pCVar16;
        vm->current_status = VM_STATUS_NO_GC;
        poVar10 = pOVar8[1].next;
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar21) = 0x103a8b;
        auVar33 = (*(code *)poVar10)(puVar23,vm);
        in_RDX.p_value = auVar33._8_8_;
        VVar15 = auVar33._0_4_;
        vm->current_status = VM_STATUS_RUNNING;
        if (vm->err_flag != false) {
          vm->err_flag = false;
          *(undefined8 *)(&stack0xffffffffffffff60 + lVar21) = 1;
          uVar30 = *(undefined8 *)(&stack0xffffffffffffff60 + lVar21);
          value_05._0_8_ = auVar33._0_8_ & 0xffffffff;
          *(undefined8 *)(&stack0xffffffffffffff60 + lVar21) = 0x103b44;
          value_05.field_1.p_value = in_RDX.p_value;
          print_value(value_05,SUB81(uVar30,0),false);
          return (InterpretResult)uVar30;
        }
      }
      pCVar16[-1].type = VVar15;
      pCVar16[-1].field_1.p_value = (uint64_t)in_RDX;
      local_38 = pCVar16;
      pbVar24 = pbVar24 + 2;
    }
    goto LAB_00103010;
  case 0x1d:
    CVar32 = create_number(-(double)local_38[-1].field_1.p_value);
    in_RDX = CVar32.field_1;
    local_38[-1].type = CVar32.type;
    local_38[-1].field_1.p_value = (uint64_t)in_RDX;
    pbVar24 = pbVar25;
    goto LAB_00103010;
  case 0x1e:
    if (local_38[-1].type != BOOLEAN) {
      return INTERPRET_RUNTIME_ERROR;
    }
    aVar17.p_value._1_7_ = 0;
    aVar17.p_value._0_1_ = local_38[-1].field_1.p_value == 0;
    local_38[-1].field_1 = aVar17;
    pbVar24 = pbVar25;
    goto LAB_00103010;
  case 0x1f:
    VVar15 = local_38[-1].type;
    aVar17 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)local_38[-1].field_1.p_value;
    printf("> ");
    value_04._4_4_ = 0;
    value_04.type = VVar15;
    value_04.field_1 =
         (anon_union_8_3_4e733eb7_for_CrispyValue_1)
         (anon_union_8_3_4e733eb7_for_CrispyValue_1)aVar17.p_value;
    print_value(value_04,true,true);
    in_RDX = extraout_RDX_02;
LAB_00103ad5:
    local_38 = local_38 + -1;
    pbVar24 = pbVar25;
    goto LAB_00103010;
  case 0x20:
    ht_init((HashTable *)auStack_98,HT_KEY_OBJSTRING,8,free_objstring);
    content.size = value.type;
    content._12_4_ = value._4_4_;
    content.key_type = auStack_98._0_4_;
    content.cap = auStack_98._4_4_;
    content.free_callback = (_func_void_HTItem_ptr *)value.field_1.p_value;
    content.buckets = ppHStack_80;
    object = new_dict(vm,content);
    goto LAB_00103683;
  case 0x21:
    object = (ObjDict *)new_list(vm,0);
LAB_00103683:
    CVar32 = create_object(&object->object);
    goto LAB_0010368b;
  case 0x22:
    if ((local_38[-2].type == OBJECT) &&
       ((((ObjList *)local_38[-2].field_1.o_value)->object).type == OBJ_LIST)) {
      value_00._4_4_ = 0;
      value_00.type = local_38[-1].type;
      value_00.field_1.p_value = local_38[-1].field_1.p_value;
      list_append((ObjList *)local_38[-2].field_1.o_value,value_00);
      in_RDX = extraout_RDX_01;
      goto LAB_001035df;
    }
    __ptr = "Can only put values into lists\n";
    sVar34 = 0x1f;
    goto LAB_00103cd0;
  case 0x23:
    if (local_38[-3].type != OBJECT) {
LAB_00103b49:
      __ptr = "Trying to retrieve an element from a primitive value\n";
LAB_00103b85:
      sVar34 = 0x35;
      goto LAB_00103cd0;
    }
    VVar15 = local_38[-1].type;
    aVar17 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)local_38[-1].field_1.p_value;
    pCVar16 = local_38 + -2;
    VVar3 = local_38[-2].type;
    dVar29 = local_38[-2].field_1.d_value;
    pOVar7 = (ObjList *)local_38[-3].field_1.o_value;
    OVar2 = (pOVar7->object).type;
    local_38 = pCVar16;
    if (OVar2 == OBJ_LIST) {
      dVar28 = floor(dVar29);
      if (((VVar3 != NUMBER) || (dVar28 != dVar29)) || (NAN(dVar28) || NAN(dVar29)))
      goto LAB_00103b8c;
      CVar32._4_4_ = 0;
      CVar32.type = VVar15;
      CVar32.field_1.p_value = aVar17.p_value;
      _Var12 = list_add(pOVar7,(long)dVar29,CVar32);
      in_RDX = extraout_RDX_04;
      pbVar24 = pbVar25;
      if (!_Var12) {
LAB_00103ba4:
        __ptr = "Index out of bounds\n";
        sVar34 = 0x14;
LAB_00103cd0:
        fwrite(__ptr,sVar34,1,_stderr);
        return INTERPRET_RUNTIME_ERROR;
      }
    }
    else {
      if (OVar2 != OBJ_DICT) {
        __ptr = "Invalid receiver for set operation\n";
        goto LAB_00103cce;
      }
      if ((VVar3 != OBJECT) || (*(int *)((long)dVar29 + 4) != 0)) {
LAB_00103b74:
        __ptr = "Only strings can be used as indices for dictionaries\n";
        goto LAB_00103b85;
      }
      value_02._4_4_ = 0;
      value_02.type = VVar15;
      key.field_0.ident_length = (size_t)pCVar16;
      key._0_8_ = dVar29;
      value_02.field_1.p_value = aVar17.p_value;
      ht_put((HashTable *)&pOVar7->content,key,value_02);
      in_RDX = extraout_RDX_00;
      pbVar24 = pbVar25;
    }
    goto LAB_00103010;
  case 0x24:
    if (local_38[-2].type != OBJECT) goto LAB_00103b49;
    VVar15 = local_38[-1].type;
    dVar29 = local_38[-1].field_1.d_value;
    pOVar7 = (ObjList *)local_38[-2].field_1.o_value;
    OVar2 = (pOVar7->object).type;
    if (OVar2 != OBJ_LIST) {
      if (OVar2 != OBJ_DICT) {
LAB_00103bf1:
        __ptr = "Invalid receiver for get operation\n";
        goto LAB_00103cce;
      }
      if ((VVar15 != OBJECT) || (*(int *)((long)dVar29 + 4) != 0)) goto LAB_00103b74;
      key_00.field_0.ident_length._0_4_ = 2;
      key_00._0_8_ = dVar29;
      key_00.field_0.ident_length._4_4_ = 0;
      CVar32 = ht_get((HashTable *)&pOVar7->content,key_00);
      goto LAB_001035d7;
    }
    dVar28 = floor(dVar29);
    if (((VVar15 != NUMBER) || (dVar28 != dVar29)) || (NAN(dVar28) || NAN(dVar29))) {
LAB_00103b8c:
      __ptr = "Only integers can be used as indices for lists\n";
      sVar34 = 0x2f;
      goto LAB_00103cd0;
    }
    _Var12 = list_get(pOVar7,(long)dVar29,(CrispyValue *)auStack_98);
    if (!_Var12) goto LAB_00103ba4;
    *(undefined1 (*) [8])(local_38 + -2) = auStack_98;
    local_38[-2].field_1 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)value._0_8_;
    in_RDX = extraout_RDX_05;
    local_38 = local_38 + -1;
    pbVar24 = pbVar25;
    goto LAB_00103010;
  case 0x25:
    if (local_38[-2].type != OBJECT) goto LAB_00103b49;
    dVar29 = local_38[-1].field_1.d_value;
    pOVar7 = (ObjList *)local_38[-2].field_1.o_value;
    OVar2 = (pOVar7->object).type;
    if (OVar2 != OBJ_DICT) {
      if (OVar2 != OBJ_LIST) goto LAB_00103bf1;
      VVar15 = local_38[-1].type;
      dVar28 = floor(dVar29);
      if (((VVar15 != NUMBER) || (dVar28 != dVar29)) || (NAN(dVar28) || NAN(dVar29)))
      goto LAB_00103b8c;
      _Var12 = list_get(pOVar7,(long)dVar29 & 0xffffffff,(CrispyValue *)auStack_98);
      in_RDX = extraout_RDX;
      auVar31 = auStack_98;
      aVar17 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)value._0_8_;
      if (_Var12) goto LAB_00103803;
      goto LAB_00103ba4;
    }
    key_01.field_0.ident_length = in_RDX.p_value;
    key_01._0_8_ = dVar29;
    CVar32 = ht_get((HashTable *)&pOVar7->content,key_01);
LAB_0010368b:
    in_RDX = CVar32.field_1;
    local_38->type = CVar32.type;
    (local_38->field_1).p_value = (uint64_t)in_RDX;
LAB_00103693:
    local_38 = local_38 + 1;
    pbVar24 = pbVar25;
    goto LAB_00103010;
  case 0x26:
    pbVar24 = puVar5 + (ushort)(*(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8);
    goto LAB_00103010;
  case 0x27:
    pCVar16 = local_38 + -2;
    if (local_38[-2].field_1.p_value == local_38[-1].field_1.p_value) {
LAB_00103058:
      local_38 = pCVar16;
      pbVar24 = puVar5 + (ushort)(*(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8);
      goto LAB_00103010;
    }
    break;
  case 0x28:
    if (local_38[-1].type != BOOLEAN) {
      return INTERPRET_RUNTIME_ERROR;
    }
    pCVar16 = local_38 + -1;
    if (local_38[-1].field_1.p_value == 1) goto LAB_00103058;
    break;
  case 0x29:
    if (local_38[-1].type != BOOLEAN) {
      return INTERPRET_RUNTIME_ERROR;
    }
    pCVar16 = local_38 + -1;
    if (local_38[-1].field_1.p_value != 1) goto LAB_00103058;
    break;
  case 0x2a:
    pCVar16 = local_38 + -2;
    if (local_38[-2].field_1.p_value != local_38[-1].field_1.p_value) goto LAB_00103058;
    break;
  case 0x2b:
    pCVar16 = local_38 + -2;
    if (local_38[-2].field_1.p_value < local_38[-1].field_1.p_value) goto LAB_00103058;
    break;
  case 0x2c:
    pCVar16 = local_38 + -2;
    if (local_38[-2].field_1.p_value <= local_38[-1].field_1.p_value) goto LAB_00103058;
    break;
  case 0x2d:
    pCVar16 = local_38 + -2;
    if (local_38[-1].field_1.p_value < local_38[-2].field_1.p_value) goto LAB_00103058;
    break;
  case 0x2e:
    pCVar16 = local_38 + -2;
    if (local_38[-1].field_1.p_value <= local_38[-2].field_1.p_value) goto LAB_00103058;
    break;
  case 0x2f:
    pCVar16 = (pCVar4->variables).values;
    pCVar16[pbVar24[1]].field_1.d_value = pCVar16[pbVar24[1]].field_1.d_value + 1.0;
    pbVar24 = pbVar24 + 2;
    goto LAB_00103010;
  case 0x30:
    pCVar16 = (pCVar4->variables).values;
    pCVar16[pbVar24[1]].field_1.d_value = pCVar16[pbVar24[1]].field_1.d_value + -1.0;
    pbVar24 = pbVar24 + 2;
    goto LAB_00103010;
  case 0x31:
    return INTERPRET_OK;
  }
  local_38 = pCVar16;
  pbVar24 = pbVar24 + 3;
  goto LAB_00103010;
}

Assistant:

static InterpretResult run(Vm *vm) {
    CallFrame *curr_frame = CURR_FRAME(vm);

    register uint8_t *ip = curr_frame->ip;
    register CrispyValue *sp = vm->sp;
    register uint8_t *code = curr_frame->code_buffer.code;

    CrispyValue *const_values = curr_frame->constants.values;
    ValueArray *variables = &curr_frame->variables;

#define READ_BYTE() (ip += 1, ip[-1])
#define READ_SHORT() (ip += 2, (uint16_t)((ip[-2] << 8) | ip[-1]))
#define READ_CONST() (const_values[READ_BYTE()])
#define READ_CONST_W() (ip += 2, const_values[(ip[-2] << 8) | ip[-1]])
#define READ_VAR() (variables->values[READ_BYTE()])
#define POP() (*(sp -= 1))
#define PUSH(value) (*sp = (value), sp += 1)
#define PEEK() (*(sp - 1))
#define BINARY_OP(op)                                           \
    do {                                                        \
        CrispyValue second = POP();                             \
        CrispyValue first = POP();                              \
        if (!CHECK_NUM(first) || !CHECK_NUM(second))            \
            goto ERROR;                                         \
        first.d_value = first.d_value op second.d_value;        \
        PUSH(first);                                            \
    } while (false)

#define COND_JUMP(op)                                           \
    do {                                                        \
        CrispyValue second = POP();                             \
        CrispyValue first = POP();                              \
        if (first.p_value op second.p_value) {                  \
            ip = code + READ_SHORT();                           \
        } else {                                                \
            READ_SHORT();                                       \
        }                                                       \
    } while(false)

    while (true) {
        OP_CODE instruction;

#if DEBUG_TRACE_EXECUTION
        {
            printf("-----\n");
            long stack_size = sp - vm->stack;
            for (int i = 0; i < stack_size; ++i) {
                printf("[%d] ", i);
                print_value(vm->stack[i], false, true);
                print_type(vm->stack[i]);
            }
            printf("sp: %li\n", stack_size);
            printf("ip: %li\n", ip - code);
            disassemble_instruction(vm, (int) (ip - code));
            printf("-----\n");
        }
#endif

#if DEBUG_TYPE_CHECK
        {
            long stack_size = sp - vm->stack;
            if (stack_size < 0) {
                printf("Negative stack pointer\n");
                goto ERROR;
            }
        }
#endif

        switch (instruction = (OP_CODE) READ_BYTE()) {
            case OP_RETURN:
                return INTERPRET_OK;
            case OP_LDC:
                PUSH(READ_CONST());
                break;
            case OP_LDC_W: {
                PUSH(READ_CONST_W());
                break;
            }
            case OP_LDC_0: {
                CrispyValue zero = create_number(0.0);
                PUSH(zero);
                break;
            }
            case OP_LDC_1: {
                CrispyValue one = create_number(1.0);
                PUSH(one);
                break;
            }
            case OP_CALL: {
                uint8_t num_args = READ_BYTE();
                CrispyValue *pos = (sp - num_args - 1);

                if (pos->type != OBJECT) {
                    fprintf(stderr, "Trying to call primitive CrispyValue\n");
                    goto ERROR;
                }

                Object *object = pos->o_value;
                object->marked = true;

                if (object->type == OBJ_NATIVE_FUNC) {
                    ObjNativeFunc *n_fn = (ObjNativeFunc *) object;
                    uint8_t expected = n_fn->num_params;

                    if (expected != num_args) {
                        fprintf(stderr, "Invalid number of arguments. Expected %d, but got %d\n", expected, num_args);
                        goto ERROR;
                    }

                    // Pop arguments from stack
                    CrispyValue args[num_args];
                    CrispyValue *start = sp - num_args;

                    for (int i = 0; i < num_args; ++i) {
                        args[i] = *(start++);
                        --sp;
                    }

                    CrispyValue res;
                    if (n_fn->system_func) {
                        vm->sp = sp;

                        // Disable garbage collection while executing native functions
                        vm->current_status = VM_STATUS_NO_GC;
                        res = ((CrispyValue (*)(CrispyValue *, Vm *vm)) n_fn->func_ptr)(args, vm);
                        vm->current_status = VM_STATUS_RUNNING;

                        if (vm->err_flag) {
                            vm->err_flag = false;
                            // the system native functions return the error message as a crispy string
                            print_value(res, true, false);
                            goto ERROR;
                        }

                    } else {
                        res = ((CrispyValue (*)(CrispyValue *)) n_fn->func_ptr)(args);
                    }

                    // pop
                    --sp;

                    PUSH(res);
                    break;
                }

                if (object->type != OBJ_LAMBDA) {
                    fprintf(stderr, "Trying to call non callable Object\n");
                    goto ERROR;
                }
                ObjLambda *lambda = ((ObjLambda *) object);

                uint8_t expected = lambda->num_params;
                if (expected != num_args) {
                    fprintf(stderr, "Invalid number of arguments. Expected %d, but got %d\n", expected, num_args);
                    goto ERROR;
                }

                // Pop arguments from stack
                CrispyValue args[num_args];
                for (int i = 0; i < num_args; ++i) {
                    args[i] = POP();
                }

                // Create a temp callframe with its own var array
                // otherwise recursion would override the variables of its predecessors on the callstack
                CallFrame *call_frame = new_temp_call_frame(lambda->call_frame);

                PUSH_FRAME(vm, call_frame);
                CrispyValue *before_sp = sp;

                for (int i = 0; i < num_args; ++i) {
                    PUSH(args[i]);
                }

                vm->sp = sp;
                InterpretResult result = run(vm);

                // free temp callframe
                temp_call_frame_free(POP_FRAME(vm));

                if (result != INTERPRET_OK) {
                    return result;
                }

                sp = before_sp;
                break;
            }
            case OP_ADD: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type == NUMBER && second.type == NUMBER) {
                    first.d_value += second.d_value;
                    PUSH(first);
                    break;
                }

                if (first.type == OBJECT) {
                    Object *first_obj = first.o_value;
                    first_obj->marked = true;

                    switch (first_obj->type) {
                        case OBJ_STRING: {
                            if (second.type != OBJECT || second.o_value->type != OBJ_STRING) {
                                fprintf(stderr,
                                        "Only strings can be appended to strings. Consider using the 'str' function\n");
                                goto ERROR;
                            }
                            ObjString *first_str = (ObjString *) first_obj;
                            ObjString *second_str = (ObjString *) second.o_value;
                            second_str->object.marked = true;

                            ObjString *dest = new_empty_string(vm, (first_str->length + second_str->length));

                            memcpy((char *) dest->start, first_str->start, first_str->length);
                            memcpy((char *) (dest->start + first_str->length), second_str->start, second_str->length);

                            PUSH(create_object((Object *) dest));
                            break;
                        }
                        case OBJ_LIST: {
                            ObjList *clone = clone_list(vm, (ObjList *) first_obj);
                            list_append(clone, second);

                            PUSH(create_object((Object *) clone));
                            break;
                        }
                        default:
                            fprintf(stderr, "Invalid target for addition\n");
                            goto ERROR;
                    }
                } else {
                    fprintf(stderr, "Invalid target for addition\n");
                    goto ERROR;
                }

                break;
            }
            case OP_SUB:
                BINARY_OP(-);
                break;
            case OP_MUL:
                BINARY_OP(*);
                break;
            case OP_MOD: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type != NUMBER || second.type != NUMBER) {
                    fprintf(stderr, "Modulo operator (%%) only works on numbers\n");
                    goto ERROR;
                }

                int64_t first_int = (int64_t) first.d_value;
                int64_t second_int = (int64_t) second.d_value;

                PUSH(create_number(first_int % second_int));
                break;
            }
            case OP_DIV: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                if (!CHECK_NUM(first) || !CHECK_NUM(second)) {
                    goto ERROR;
                }

                if (second.d_value == 0) {
                    panic(vm, "Cannot divide by zero\n");
                }

                first.d_value = first.d_value / second.d_value;
                PUSH(first);
                break;
            }
            case OP_POW: {
                CrispyValue exponent = POP();
                CrispyValue base = POP();

                if (!CHECK_NUM(base) || !CHECK_NUM(exponent)) {
                    goto ERROR;
                }

                PUSH(create_number(pow(base.d_value, exponent.d_value)));

                break;
            }
            case OP_OR: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type != BOOLEAN || second.type != BOOLEAN) {
                    goto ERROR;
                }

                PUSH(create_bool(first.p_value || second.p_value));

                break;
            }
            case OP_AND: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type != BOOLEAN || second.type != BOOLEAN) {
                    goto ERROR;
                }

                PUSH(create_bool(first.p_value && second.p_value));

                break;
            }
            case OP_EQUAL: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) == 0));
                break;
            }
            case OP_NOT_EQUAL: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) != 0));
                break;
            }
            case OP_GE: {
                // TODO exception for non orderable type (e.g nil)
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) >= 0));
                break;
            }
            case OP_LE: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) <= 0));
                break;
            }
            case OP_GT: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) > 0));
                break;
            }
            case OP_LT: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) < 0));
                break;
            }
            case OP_NEGATE: {
                CrispyValue val = create_number(POP().d_value * -1);
                PUSH(val);
                break;
            }
            case OP_LOAD: {
                CrispyValue val = READ_VAR();
                PUSH(val);
                break;
            }
            case OP_LOAD_OFFSET: {
                uint8_t scope = READ_BYTE();
                uint8_t index = READ_BYTE();

                CallFrame *frame = FRAME_AT(vm, scope);
                CrispyValue val = frame->variables.values[index];

                PUSH(val);

                break;
            }
            case OP_STORE_OFFSET: {
                uint8_t scope = READ_BYTE();
                uint8_t index = READ_BYTE();

                CallFrame *frame = FRAME_AT(vm, scope);
                CrispyValue val = POP();

                frame->variables.values[index] = val;
                break;
            }
            case OP_STORE: {
                uint8_t index = READ_BYTE();
                CrispyValue val = POP();
                write_at(variables, index, val);
                break;
            }
            case OP_POP:
                --sp;
                break;
            case OP_DUP: {
                CrispyValue val = PEEK();
                PUSH(val);
                break;
            }
            case OP_JMP:
                ip = code + READ_SHORT();
                break;
            case OP_JMT: {
                CrispyValue value = POP();
                if (!CHECK_BOOL(value)) { goto ERROR; }
                if (BOOL_TRUE(value)) {
                    ip = code + READ_SHORT();
                } else {
                    ip += 2;
                }
                break;
            }
            case OP_JMF: {
                CrispyValue value = POP();
                if (!CHECK_BOOL(value)) { goto ERROR; }
                if (!BOOL_TRUE(value)) {
                    ip = code + READ_SHORT();
                } else {
                    ip += 2;
                }
                break;
            }
            case OP_JEQ:
                COND_JUMP(==);
                break;
            case OP_JNE:
                COND_JUMP(!=);
                break;
            case OP_JLT:
                COND_JUMP(<);
                break;
            case OP_JLE:
                COND_JUMP(<=);
                break;
            case OP_JGT:
                COND_JUMP(>);
                break;
            case OP_JGE:
                COND_JUMP(>=);
                break;
            case OP_INC_1: {
                uint8_t index = READ_BYTE();
                ++variables->values[index].d_value;
                break;
            }
            case OP_DEC_1: {
                uint8_t index = READ_BYTE();
                --variables->values[index].d_value;
                break;
            }
            case OP_NOT: {
                CrispyValue value = POP();

                if (value.type != BOOLEAN) {
                    goto ERROR;
                }

                value.p_value = value.p_value == 0 ? 1 : 0;
                PUSH(value);
                break;
            }
            case OP_TRUE:
                PUSH(create_bool(true));
                break;
            case OP_FALSE:
                PUSH(create_bool(false));
                break;
            case OP_NOP:
                PUSH(create_bool(false));
                break;
            case OP_NIL:
                PUSH(create_nil());
                break;
            case OP_PRINT: {
                CrispyValue value = POP();
                printf("> ");
                print_value(value, true, true);
                break;
            }
            case OP_DICT_NEW: {
                HashTable content;
                ht_init(&content, HT_KEY_OBJSTRING, 8, free_objstring);

                ObjDict *dict = new_dict(vm, content);
                CrispyValue value = create_object((Object *) dict);
                PUSH(value);
                break;
            }
            case OP_LIST_NEW: {
                ObjList *list = new_list(vm, 0);
                CrispyValue list_val = create_object((Object *) list);

                PUSH(list_val);
                break;
            }
            case OP_LIST_APPEND: {
                CrispyValue value = POP();
                CrispyValue list_val = PEEK();

                if (list_val.type != OBJECT || list_val.o_value->type != OBJ_LIST) {
                    fprintf(stderr, "Can only put values into lists\n");
                    goto ERROR;
                }

                ObjList *list = (ObjList *) list_val.o_value;

                list_append(list, value);
                break;
            }
            case OP_STRUCT_SET: {
                CrispyValue value = POP();
                CrispyValue key = POP();
                CrispyValue structure = PEEK();

                if (structure.type != OBJECT) {
                    fprintf(stderr, "Trying to retrieve an element from a primitive value\n");
                    goto ERROR;
                }

                Object *obj = structure.o_value;

                switch (obj->type) {
                    case OBJ_DICT: {
                        ObjDict *dict = (ObjDict *) obj;

                        if (key.type != OBJECT) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }

                        HTItemKey ht_key;
                        Object *key_obj = key.o_value;

                        if (key_obj->type != OBJ_STRING) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }

                        ht_key.key_obj_string = (ObjString *) key_obj;
                        ht_put(&dict->content, ht_key, value);
                        break;
                    }
                    case OBJ_LIST: {
                        ObjList *list = (ObjList *) obj;

                        // Check if key is an integer
                        if (key.type != NUMBER || floor(key.d_value) != key.d_value) {
                            fprintf(stderr, "Only integers can be used as indices for lists\n");
                            goto ERROR;
                        }

                        int64_t index = (int64_t) key.d_value;
                        bool success = list_add(list, index, value);

                        if (!success) {
                            fprintf(stderr, "Index out of bounds\n");
                            goto ERROR;
                        }

                        break;
                    }
                    default:
                        fprintf(stderr, "Invalid receiver for set operation\n");
                        goto ERROR;
                }

                break;
            }
            case OP_STRUCT_GET: {
                CrispyValue key_val = POP();
                CrispyValue struct_val = POP();

                if (struct_val.type != OBJECT) {
                    fprintf(stderr, "Trying to retrieve an element from a primitive value\n");
                    goto ERROR;
                }

                Object *obj = struct_val.o_value;

                switch (obj->type) {
                    case OBJ_DICT: {
                        if (key_val.type != OBJECT) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }


                        ObjDict *dict = (ObjDict *) obj;
                        Object *key_obj = key_val.o_value;

                        if (key_obj->type != OBJ_STRING) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }

                        ObjString *key_string = (ObjString *) key_obj;

                        HTItemKey key;
                        key.key_obj_string = key_string;

                        CrispyValue result = ht_get(&dict->content, key);
                        PUSH(result);
                        break;
                    }
                    case OBJ_LIST: {
                        ObjList *list = (ObjList *) obj;

                        // Check if key is an integer
                        if (key_val.type != NUMBER || floor(key_val.d_value) != key_val.d_value) {
                            fprintf(stderr, "Only integers can be used as indices for lists\n");
                            goto ERROR;
                        }

                        int64_t index = (int64_t) key_val.d_value;
                        CrispyValue value;
                        bool success = list_get(list, index, &value);

                        if (!success) {
                            fprintf(stderr, "Index out of bounds\n");
                            goto ERROR;
                        }

                        PUSH(value);
                        break;
                    }
                    default:
                        fprintf(stderr, "Invalid receiver for get operation\n");
                        goto ERROR;
                }

                break;
            }
            case OP_STRUCT_PEEK: {
                CrispyValue key_val = PEEK();
                CrispyValue struct_val = sp[-2];

                if (struct_val.type != OBJECT) {
                    fprintf(stderr, "Trying to retrieve an element from a primitive value\n");
                    goto ERROR;
                }

                Object *obj = struct_val.o_value;

                switch (obj->type) {
                    case OBJ_LIST: {
                        ObjList *list = (ObjList *) struct_val.o_value;

                        // Check if key is an integer
                        if (key_val.type != NUMBER || floor(key_val.d_value) != key_val.d_value) {
                            fprintf(stderr, "Only integers can be used as indices for lists\n");
                            goto ERROR;
                        }

                        uint32_t index = (uint32_t) key_val.d_value;
                        CrispyValue value;
                        bool success = list_get(list, index, &value);

                        if (!success) {
                            fprintf(stderr, "Index out of bounds\n");
                            goto ERROR;
                        }

                        PUSH(value);
                        break;
                    }
                    case OBJ_DICT: {
                        ObjDict *dict = (ObjDict *) struct_val.o_value;
                        ObjString *key_string = (ObjString *) key_val.o_value;

                        HTItemKey key;
                        key.key_obj_string = key_string;

                        CrispyValue result = ht_get(&dict->content, key);
                        PUSH(result);
                        break;
                    }
                    default:
                        fprintf(stderr, "Invalid receiver for get operation\n");
                        goto ERROR;
                }

                break;
            }
            default:
                printf("Unknown instruction %d\n", instruction);
                return INTERPRET_RUNTIME_ERROR;
        }
    }

    ERROR:
    return INTERPRET_RUNTIME_ERROR;

#undef COND_JUMP
#undef BINARY_OP
#undef PEEK
#undef PUSH
#undef POP
#undef READ_VAR
#undef READ_CONST
#undef READ_CONST_W
#undef READ_SHORT
#undef READ_BYTE
}